

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<unsigned_short> *
testing::internal::ActionResultHolder<unsigned_short>::PerformDefaultAction<unsigned_short()>
          (FunctionMocker<unsigned_short_()> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  Result_conflict value;
  ActionResultHolder<unsigned_short> *this;
  Wrapper local_22;
  string *local_20;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<unsigned_short_()> *func_mocker_local;
  
  local_20 = call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)func_mocker;
  this = (ActionResultHolder<unsigned_short> *)operator_new(0x10);
  value = FunctionMocker<unsigned_short_()>::PerformDefaultAction
                    ((FunctionMocker<unsigned_short_()> *)args_local,
                     (ArgumentTuple *)call_description_local,local_20);
  ReferenceOrValueWrapper<unsigned_short>::ReferenceOrValueWrapper(&local_22,value);
  ActionResultHolder(this,local_22);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }